

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O2

error<idx2::idx2_err_code> idx2::Encode(idx2_file *Idx2,params *P,brick_copier *Copier)

{
  cstr __s;
  anon_struct_16_2_94731cea_for_anon_union_16_4_6ba14846_for_v2<double>_1_0 aVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  int iVar5;
  anon_union_16_4_6ba14846_for_v2<double>_1 aVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  int iVar13;
  long lVar14;
  u64 uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  timer *Key;
  char *pcVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  u64 uVar23;
  ulong uVar24;
  brick_volume *Val;
  uint uVar25;
  uint uVar26;
  idx2_file *Idx2_00;
  char cVar27;
  brick_traverse *pbVar28;
  ulong uVar29;
  long *in_FS_OFFSET;
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined8 in_XMM5_Qb;
  extent eVar35;
  error<idx2::idx2_err_code> eVar36;
  v3i Brick3;
  unsigned_long auStack_2738 [73];
  extent BrickExtent;
  extent Skip;
  timer Timer;
  int iStack_24a8;
  uint uStack_24a4;
  uint uStack_24a0;
  int aiStack_249c [3];
  u64 uStack_2490;
  int iStack_2488;
  undefined4 uStack_2484;
  u64 uStack_2480;
  idx2_file *local_2470;
  iterator local_2468;
  int iStack_2448;
  int iStack_2444;
  long lStack_2440;
  int iStack_2438;
  undefined4 uStack_2434;
  long lStack_2430;
  ulong local_2428;
  ulong local_2420;
  params *local_2418;
  brick_copier *local_2410;
  v3i *local_2408;
  u64 BrickKey;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Encode_cpp:394:3)>
  __ScopeGuard__394;
  extent BrickExtentCrop;
  encode_data E;
  brick_traverse Stack [128];
  
  auVar32 = in_ZMM1._0_16_;
  iVar13 = (Idx2->BrickDimsExt3).field_0.field_0.X;
  iVar4 = (Idx2->BrickDimsExt3).field_0.field_0.Y;
  iVar5 = (Idx2->BrickDimsExt3).field_0.field_0.Z;
  local_2410 = Copier;
  Mallocator();
  free_list_allocator::free_list_allocator
            ((free_list_allocator *)Stack,(long)(iVar13 * iVar4 * iVar5 * 8),
             &Mallocator::Instance.super_allocator);
  auVar30._8_8_ = Stack[0].BrickFrom3.field_0.field_3.XY.field_0;
  auVar30._0_8_ = Stack[0].PrevOrder;
  BrickAlloc_._24_4_ = Stack[0].BrickFrom3.field_0.field_0.Z;
  BrickAlloc_._8_16_ = auVar30;
  BrickAlloc_._28_8_ = Stack[0].BrickTo3.field_0.field_3.XY.field_0;
  BrickAlloc_._36_4_ = Stack[0].BrickTo3.field_0.field_0.Z;
  auVar31 = ZEXT1664(auVar30);
  auVar33 = ZEXT1664(auVar32);
  encode_data::encode_data(&E);
  __ScopeGuard__394.Dismissed = false;
  __ScopeGuard__394.Func.E = &E;
  Init(&E,(allocator *)0x0);
  local_2408 = &Idx2->BrickDimsExt3;
  lVar14 = 0x38;
  do {
    *(undefined8 *)((long)Stack + lVar14 + -0x10) = 0;
    *(undefined4 *)((long)Stack + lVar14 + -8) = 0;
    *(undefined8 *)((long)&Stack[0].BrickOrder + lVar14) = 0;
    lVar14 = lVar14 + 0x40;
  } while (lVar14 != 0x2038);
  lVar14 = (long)E.Level;
  if (lVar14 < 0x10) {
    lVar21 = (long)(Idx2->NBricks3).Arr[lVar14].field_0.field_0.X;
    if (lVar21 == 0) {
      uVar29 = 1;
    }
    else {
      uVar22 = lVar21 - 1;
      lVar21 = 0x3f;
      if (uVar22 != 0) {
        for (; uVar22 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      uVar29 = 1L << (-((byte)lVar21 ^ 0x3f) & 0x3f) & 0xffffffff;
      if (uVar22 == 0) {
        uVar29 = 1;
      }
    }
    lVar21 = (long)(Idx2->NBricks3).Arr[lVar14].field_0.field_0.Y;
    uVar22 = 0x100000000;
    if (lVar21 != 0) {
      uVar24 = lVar21 - 1;
      lVar21 = 0x3f;
      if (uVar24 != 0) {
        for (; uVar24 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      if (uVar24 != 0) {
        uVar22 = 0x100000000 << (-((byte)lVar21 ^ 0x3f) & 0x3f);
      }
    }
    lVar21 = (long)(Idx2->NBricks3).Arr[lVar14].field_0.field_0.Z;
    if (lVar21 == 0) {
      Stack[0].BrickTo3.field_0._8_4_ = 1;
    }
    else {
      uVar24 = lVar21 - 1;
      lVar21 = 0x3f;
      if (uVar24 != 0) {
        for (; uVar24 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      Stack[0].BrickTo3.field_0._8_4_ = 1;
      if (uVar24 != 0) {
        Stack[0].BrickTo3.field_0._8_4_ = (int)(1L << (-((byte)lVar21 ^ 0x3f) & 0x3f));
      }
    }
    Stack[0].BrickOrder = (Idx2->BricksOrder).Arr[lVar14];
    Stack[0].PrevOrder = Stack[0].BrickOrder;
    Stack[0].BrickFrom3.field_0.field_3.XY.field_0 = (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
    Stack[0].BrickFrom3.field_0.field_0.Z = 0;
    Stack[0].BrickTo3.field_0.field_3.XY.field_0 = uVar22 | uVar29;
    Stack[0].NBricksBefore = 0;
    Stack[0].BrickInChunk = 0;
    Stack[0].Address = 0;
    uVar29 = 0;
    Idx2_00 = Idx2;
LAB_0016c92b:
    do {
      pbVar28 = Stack + uVar29;
LAB_0016c93c:
      auVar30 = auVar31._0_16_;
      auVar32 = auVar33._0_16_;
      if ((int)uVar29 < 0) {
        clock_gettime(1,(timespec *)&Timer);
        eVar36 = FlushChunks(Idx2_00,&E);
        pcVar19 = eVar36.Msg;
        if (eVar36.Code == NoError) {
          eVar36 = FlushChunkExponents(Idx2_00,&E);
          pcVar19 = eVar36.Msg;
          if (eVar36.Code == NoError) {
            clock_gettime(1,(timespec *)Stack);
            TotalTime_ = (double)(long)((double)(long)(Stack[0].BrickOrder - Timer.Start.tv_sec) *
                                        1000000000.0 +
                                       (double)(long)(Stack[0].PrevOrder - Timer.Start.tv_nsec)) /
                         1000000000.0 + TotalTime_;
            __s = (cstr)(*in_FS_OFFSET + -0xf80);
            pcVar19 = (P->Meta).Field;
            snprintf(__s,0x400,"%s/%s/%s.idx2",P->OutDir,&P->Meta,pcVar19);
            WriteMetaFile(Idx2_00,P,__s);
            printf("num channels            = %li\n",E.Channels.Size);
            printf("num sub channels        = %li\n",E.SubChannels.Size);
            snprintf(__s,0x400,"%s/%s/%s.idx2",P->OutDir,&P->Meta,pcVar19);
            PrintStats(__s);
            printf("total time              = %f seconds\n",TotalTime_);
            *(char **)(*in_FS_OFFSET + -0xb80) =
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
            ;
            *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x1bb;
            pcVar19 = "";
            uVar29 = 0;
            goto LAB_0016d096;
          }
          uVar29 = eVar36._8_8_ >> 8 & 0xffffff;
          cVar27 = (char)uVar29;
          if ('?' < cVar27) {
            __assert_fail("false && \"stack too deep\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
                          ,0x1b0,
                          "auto idx2::Encode(idx2_file *, const params &, brick_copier &)::(anonymous class)::operator()() const"
                         );
          }
          uVar16 = eVar36._8_4_ & 0xff00ff | ((int)uVar29 + 1U & 0xff) << 8;
          lVar14 = (long)cVar27;
          *(undefined4 *)(*in_FS_OFFSET + -0x97c + lVar14 * 4) = 0x1b0;
        }
        else {
          uVar29 = eVar36._8_8_ >> 8 & 0xffffff;
          cVar27 = (char)uVar29;
          if ('?' < cVar27) {
            __assert_fail("false && \"stack too deep\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
                          ,0x1af,
                          "auto idx2::Encode(idx2_file *, const params &, brick_copier &)::(anonymous class)::operator()() const"
                         );
          }
          uVar16 = eVar36._8_4_ & 0xff00ff | ((int)uVar29 + 1U & 0xff) << 8;
          lVar14 = (long)cVar27;
          *(undefined4 *)(*in_FS_OFFSET + -0x97c + lVar14 * 4) = 0x1af;
        }
        uVar29 = (ulong)uVar16;
        *(char **)(*in_FS_OFFSET + -0xb78 + lVar14 * 8) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
        ;
LAB_0016d096:
        scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp:394:3)>
        ::~scope_guard(&__ScopeGuard__394);
        eVar36.Code = (char)uVar29;
        eVar36.StackIdx = (char)(uVar29 >> 8);
        eVar36.StrGened = (bool)(char)(uVar29 >> 0x10);
        eVar36._11_5_ = (int5)(uVar29 >> 0x18);
        eVar36.Msg = pcVar19;
        return eVar36;
      }
      uVar22 = pbVar28->BrickOrder;
      uVar24 = uVar22 >> 2;
      pbVar28->BrickOrder = uVar24;
      uVar16 = (uint)uVar22 & 3;
      if (uVar16 == 3) {
        if (uVar24 == 3) {
          pbVar28->BrickOrder = Stack[uVar29].PrevOrder;
        }
        else {
          Stack[uVar29].PrevOrder = uVar24;
        }
        goto LAB_0016c93c;
      }
      uVar22 = (ulong)((int)uVar29 - 1);
      iVar13 = Stack[uVar29].BrickFrom3.field_0.field_0.X;
      local_2470 = Idx2_00;
      if (((Stack[uVar29].BrickTo3.field_0.field_0.X - iVar13 != 1) ||
          (iVar4 = Stack[uVar29].BrickFrom3.field_0.field_0.Y,
          Stack[uVar29].BrickTo3.field_0.field_0.Y - iVar4 != 1)) ||
         (iVar5 = Stack[uVar29].BrickFrom3.field_0.field_0.Z,
         Stack[uVar29].BrickTo3.field_0.field_0.Z - iVar5 != 1)) {
        Timer.Start.tv_sec = pbVar28->BrickOrder;
        Timer.Start.tv_nsec = Stack[uVar29].PrevOrder;
        uVar24 = *(ulong *)&Stack[uVar29].BrickFrom3.field_0;
        uVar8 = *(undefined8 *)((long)&Stack[uVar29].BrickFrom3.field_0 + 8);
        uVar9 = *(undefined8 *)((long)&Stack[uVar29].BrickTo3.field_0 + 4);
        uStack_2490 = Stack[uVar29].NBricksBefore;
        uStack_2480 = Stack[uVar29].Address;
        aiStack_249c[1] = (int)uVar9;
        aiStack_249c[2] = (int)((ulong)uVar9 >> 0x20);
        iStack_2488 = (int)*(undefined8 *)&Stack[uVar29].BrickInChunk;
        uStack_2484 = (undefined4)((ulong)*(undefined8 *)&Stack[uVar29].BrickInChunk >> 0x20);
        iStack_24a8 = (int)uVar24;
        uStack_24a4 = (uint)(uVar24 >> 0x20);
        uStack_24a0 = (uint)uVar8;
        aiStack_249c[0] = (int)((ulong)uVar8 >> 0x20);
        auVar2 = *(undefined1 (*) [32])pbVar28;
        auVar3 = *(undefined1 (*) [32])((long)&Stack[uVar29].BrickFrom3.field_0 + 8);
        iStack_2448 = auVar3._8_4_;
        iStack_2444 = auVar3._12_4_;
        lStack_2440 = auVar3._16_8_;
        iStack_2438 = auVar3._24_4_;
        uStack_2434 = auVar3._28_4_;
        local_2468.Key = auVar2._0_8_;
        local_2468.Val = auVar2._8_8_;
        local_2468.Ht._0_4_ = auVar2._16_4_;
        local_2468.Ht._4_4_ = auVar2._20_4_;
        local_2468.Idx._0_4_ = auVar2._24_4_;
        local_2468.Idx._4_4_ = auVar2._28_4_;
        uVar18 = (ulong)(uVar16 << 2);
        iVar13 = *(int *)((long)&Stack[uVar29].BrickFrom3.field_0 + uVar18);
        iVar13 = (*(int *)((long)&Stack[uVar29].BrickTo3.field_0 + uVar18) - iVar13) / 2 + iVar13;
        local_2418 = P;
        *(int *)((long)aiStack_249c + uVar18) = iVar13;
        uVar15 = uStack_2490;
        iVar12 = aiStack_249c[2];
        iVar5 = aiStack_249c[1];
        iVar4 = aiStack_249c[0];
        *(int *)((long)&local_2468.Ht + uVar18) = iVar13;
        local_2420 = uVar24 & 0xffffffff;
        local_2428 = (ulong)uStack_24a4;
        uVar16 = aiStack_249c[0] - iStack_24a8;
        uVar25 = aiStack_249c[1] - uStack_24a4;
        uVar26 = aiStack_249c[2] - uStack_24a0;
        Skip.From = (ulong)(uStack_24a0 & 0x1fffff) << 0x2a |
                    (local_2428 & 0x1fffff) << 0x15 | uVar24 & 0x1fffff;
        Skip.Dims = (ulong)(uVar26 & 0x1fffff) << 0x2a |
                    (ulong)(uVar25 & 0x1fffff) << 0x15 | (ulong)(uVar16 & 0x1fffff);
        lVar14 = (long)E.Level;
        if (0xf < lVar14) break;
        BrickExtent.From = 0;
        BrickExtent.Dims =
             (ulong)((Idx2->NBricks3).Arr[lVar14].field_0.field_0.Z & 0x1fffff) << 0x2a |
             ((ulong)(uint)(Idx2->NBricks3).Arr[lVar14].field_0.field_0.Y & 0x1fffff) << 0x15 |
             (ulong)(uint)(Idx2->NBricks3).Arr[lVar14].field_0.field_0.X & 0x1fffff;
        auVar31 = ZEXT1664(auVar2._0_16_);
        auVar33 = ZEXT1664(auVar3._0_16_);
        eVar35 = Crop<idx2::extent,idx2::extent>(&Skip,&BrickExtent);
        iVar13 = iStack_2488;
        uVar23 = eVar35.Dims;
        lStack_2440 = ((long)(uVar23 << 0x16) >> 0x2b) * ((long)(uVar23 << 0x2b) >> 0x2b) *
                      ((long)(uVar23 * 2) >> 0x2b) + uVar15;
        lVar14 = (long)E.Level;
        if (0xf < lVar14) break;
        BrickExtent.From = 0;
        BrickExtent.Dims =
             (ulong)((Idx2->NBricks3).Arr[lVar14].field_0.field_0.Z & 0x1fffff) << 0x2a |
             ((ulong)(uint)(Idx2->NBricks3).Arr[lVar14].field_0.field_0.Y & 0x1fffff) << 0x15 |
             (ulong)(uint)(Idx2->NBricks3).Arr[lVar14].field_0.field_0.X & 0x1fffff;
        eVar35 = Crop<idx2::extent,idx2::extent>(&Skip,&BrickExtent);
        iStack_2438 = (((int)eVar35.Dims << 0xb) >> 0xb) * (int)((long)(eVar35.Dims * 2) >> 0x2b) *
                      (int)((long)(eVar35.Dims << 0x16) >> 0x2b) + iVar13;
        uStack_2480 = Stack[uVar29].Address;
        lStack_2430 = (long)(int)uVar26 * (long)(int)uVar25 * (long)(int)uVar16 + uStack_2480;
        lVar14 = (long)E.Level;
        if (0xf < lVar14) break;
        iVar13 = ((Idx2->NBricks3).Arr[lVar14].field_0.field_0.Z << 0xb) >> 0xb;
        iVar20 = ((Idx2->NBricks3).Arr[lVar14].field_0.field_0.X << 0xb) >> 0xb;
        iVar17 = (int)((long)((ulong)(uint)(Idx2->NBricks3).Arr[lVar14].field_0.field_0.Y << 0x2b)
                      >> 0x2b);
        if (((((int)local_2468.Ht < iVar20) && (local_2468.Ht._4_4_ < iVar17)) &&
            (((int)local_2468.Idx < iVar13 && ((0 < local_2468.Idx._4_4_ && (0 < iStack_2448))))))
           && (0 < iStack_2444)) {
          auVar2._8_8_ = local_2468.Val;
          auVar2._0_8_ = local_2468.Key;
          auVar2._16_4_ = (int)local_2468.Ht;
          auVar2._20_4_ = local_2468.Ht._4_4_;
          auVar2._24_4_ = (int)local_2468.Idx;
          auVar2._28_4_ = local_2468.Idx._4_4_;
          auVar31 = ZEXT3264(auVar2);
          auVar3._4_4_ = iStack_2444;
          auVar3._0_4_ = iStack_2448;
          auVar3._8_8_ = lStack_2440;
          auVar3._16_4_ = iStack_2438;
          auVar3._20_4_ = uStack_2434;
          auVar3._24_8_ = lStack_2430;
          auVar33 = ZEXT3264(auVar3);
          *(undefined1 (*) [32])((long)&Stack[uVar29].BrickTo3.field_0 + 4) = auVar3;
          *(undefined1 (*) [32])pbVar28 = auVar2;
          uVar22 = uVar29;
        }
        uVar29 = uVar22;
        Idx2_00 = local_2470;
        P = local_2418;
        if (((((int)local_2420 < iVar20) && ((int)local_2428 < iVar17)) &&
            ((int)uStack_24a0 < iVar13)) && (0 < iVar12 && (0 < iVar5 && 0 < iVar4))) {
          uVar29 = (ulong)((int)uVar29 + 1);
          auVar10._8_8_ = Timer.Start.tv_nsec;
          auVar10._0_8_ = Timer.Start.tv_sec;
          auVar10._16_4_ = iStack_24a8;
          auVar10._20_4_ = uStack_24a4;
          auVar10._24_4_ = uStack_24a0;
          auVar10._28_4_ = aiStack_249c[0];
          auVar31 = ZEXT3264(auVar10);
          auVar11._4_4_ = aiStack_249c[2];
          auVar11._0_4_ = aiStack_249c[1];
          auVar11._8_8_ = uStack_2490;
          auVar11._16_4_ = iStack_2488;
          auVar11._20_4_ = uStack_2484;
          auVar11._24_8_ = uStack_2480;
          auVar33 = ZEXT3264(auVar11);
          *(undefined1 (*) [32])((long)&Stack[uVar29].BrickTo3.field_0 + 4) = auVar11;
          *(undefined1 (*) [32])(Stack + uVar29) = auVar10;
        }
        goto LAB_0016c92b;
      }
      clock_gettime(1,(timespec *)&Skip);
      brick_volume::brick_volume((brick_volume *)&Timer);
      Resize((volume *)&Timer,local_2408,float64,E.Alloc);
      Idx2_00 = local_2470;
      lVar14 = CONCAT44(aiStack_249c[0],uStack_24a0);
      Val = (brick_volume *)0x1fffff;
      for (lVar21 = 0;
          ((lVar14 << 0x16) >> 0x2b) * (lVar14 * 2 >> 0x2b) * ((lVar14 << 0x2b) >> 0x2b) * 8 !=
          lVar21; lVar21 = lVar21 + 8) {
        *(undefined8 *)(Timer.Start.tv_sec + lVar21) = 0;
      }
      uVar16 = (local_2470->BrickDims3).field_0.field_0.X;
      uVar25 = (local_2470->BrickDims3).field_0.field_0.Y;
      uVar26 = (local_2470->BrickDims3).field_0.field_0.Z;
      BrickExtent.From =
           (ulong)(iVar5 * uVar26 & 0x1fffff) << 0x2a |
           (ulong)(iVar4 * uVar25 & 0x1fffff) << 0x15 | (ulong)(iVar13 * uVar16 & 0x1fffff);
      BrickExtent.Dims =
           (ulong)(uVar26 & 0x1fffff) << 0x2a |
           ((ulong)uVar25 & 0x1fffff) << 0x15 | (ulong)uVar16 & 0x1fffff;
      local_2468.Key = (unsigned_long *)0x0;
      local_2468.Val =
           (brick_volume *)
           ((ulong)((local_2470->Dims3).field_0.field_0.Z & 0x1fffff) << 0x2a |
           ((ulong)(uint)(local_2470->Dims3).field_0.field_0.Y & 0x1fffff) << 0x15 |
           (ulong)(uint)(local_2470->Dims3).field_0.field_0.X & 0x1fffff);
      BrickExtentCrop = Crop<idx2::extent,idx2::extent>(&BrickExtent,(extent *)&local_2468);
      eVar35 = Relative<idx2::extent,idx2::extent>(&BrickExtentCrop,&BrickExtent);
      uStack_2490 = eVar35.From;
      iStack_2488 = (int)eVar35.Dims;
      uStack_2484 = eVar35.Dims._4_4_;
      (**local_2410->_vptr_brick_copier)(local_2410,&BrickExtentCrop,&uStack_2490,&Timer);
      aVar1 = (Idx2_00->ValueRange).field_0.field_0;
      auVar34._8_8_ = aVar1.Y;
      auVar34._0_8_ = auVar30._0_8_;
      auVar7 = vunpcklpd_avx((undefined1  [16])aVar1,auVar32);
      auVar7 = vcmppd_avx(auVar34,auVar7,1);
      auVar30 = vunpcklpd_avx(auVar30,auVar32);
      aVar6.field_0 =
           (anon_struct_16_2_94731cea_for_anon_union_16_4_6ba14846_for_v2<double>_1_0)
           vblendvpd_avx(aVar1,auVar30,auVar7);
      (Idx2_00->ValueRange).field_0 = aVar6;
      E.Level = '\0';
      E.Bricks3.Arr[0].field_0.field_0.Z = Stack[uVar29].BrickFrom3.field_0.field_0.Z;
      E.Bricks3.Arr[0].field_0.field_3.XY.field_0 =
           (v2<int>)*(undefined8 *)&Stack[uVar29].BrickFrom3.field_0;
      Brick3.field_0.field_0.Y = 0;
      Brick3.field_0.field_0.X = E.Bricks3.Arr[0].field_0.field_0.Z;
      Brick3.field_0._8_4_ = SUB84(Val,0);
      uVar15 = GetLinearBrick((idx2 *)Idx2_00,(idx2_file *)0x0,E.Bricks3.Arr[0].field_0._0_4_,Brick3
                             );
      lVar14 = (long)E.Level;
      if (0xf < lVar14) goto LAB_0016d252;
      E.Brick.Arr[lVar14] = uVar15;
      BrickKey = uVar15 * 0x10 + lVar14;
      Key = &Timer;
      Insert<unsigned_long,idx2::brick_volume>
                (&local_2468,(idx2 *)&E.BrickPool,
                 (hash_table<unsigned_long,_idx2::brick_volume> *)&BrickKey,(unsigned_long *)Key,Val
                );
      EncodeBrick(Idx2_00,(params *)&E,(encode_data *)0x0,SUB81(Key,0));
      clock_gettime(1,(timespec *)&local_2468);
      auVar33 = ZEXT1664(CONCAT88(in_XMM5_Qb,(double)(long)((long)local_2468.Val - Skip.Dims)));
      TotalTime_ = (double)(long)((double)(long)((long)local_2468.Key - Skip.From) * 1000000000.0 +
                                 (double)(long)((long)local_2468.Val - Skip.Dims)) / 1000000000.0 +
                   TotalTime_;
      auVar31 = ZEXT864((ulong)TotalTime_);
      uVar29 = uVar22;
    } while( true );
  }
  pcVar19 = 
  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]";
LAB_0016d226:
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,pcVar19);
LAB_0016d252:
  pcVar19 = 
  "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]";
  goto LAB_0016d226;
}

Assistant:

error<idx2_err_code>
Encode(idx2_file* Idx2, const params& P, brick_copier& Copier)
{
  const int BrickBytes = Prod(Idx2->BrickDimsExt3) * sizeof(f64);
  BrickAlloc_ = free_list_allocator(BrickBytes);
  idx2_RAII(encode_data, E, Init(&E));
  idx2_BrickTraverse(
    timer Timer; StartTimer(&Timer);
    //    idx2_Assert(GetLinearBrick(*Idx2, 0, Top.BrickFrom3) == Top.Address);
    //    idx2_Assert(GetSpatialBrick(*Idx2, 0, Top.Address) == Top.BrickFrom3);
    // BVol = local brick storage (we will copy brick data from the input to this)
    brick_volume BVol;
    Resize(&BVol.Vol, Idx2->BrickDimsExt3, dtype::float64, E.Alloc);
    Fill(idx2_Range(f64, BVol.Vol), 0.0);
    extent BrickExtent(Top.BrickFrom3 * Idx2->BrickDims3, Idx2->BrickDims3);
    // BrickExtentCrop = the true extent of the brick (boundary bricks are cropped)
    extent BrickExtentCrop = Crop(BrickExtent, extent(Idx2->Dims3));
    BVol.ExtentLocal = Relative(BrickExtentCrop, BrickExtent);
    v2d MinMax = Copier.Copy(BrickExtentCrop, BVol.ExtentLocal, &BVol);
    Idx2->ValueRange.Min = Min(Idx2->ValueRange.Min, MinMax.Min);
    Idx2->ValueRange.Max = Max(Idx2->ValueRange.Max, MinMax.Max);
    //    Copy(BrickExtentCrop, Vol, BVol.ExtentLocal, &BVol.Vol);
    E.Level = 0;
    E.Bricks3[E.Level] = Top.BrickFrom3;
    E.Brick[E.Level] = GetLinearBrick(*Idx2, E.Level, E.Bricks3[E.Level]);
    idx2_Assert(E.Brick[E.Level] == Top.Address);
    u64 BrickKey = GetBrickKey(E.Level, E.Brick[E.Level]);
    Insert(&E.BrickPool, BrickKey, BVol);
    EncodeBrick(Idx2, P, &E);
    TotalTime_ += Seconds(ElapsedTime(&Timer));
    ,
    128,
    Idx2->BricksOrder[E.Level],
    v3i(0),
    Idx2->NBricks3[E.Level],
    extent(Idx2->NBricks3[E.Level]),
    extent(Idx2->NBricks3[E.Level])
  );

  /* dump the bit streams to files */
  timer Timer;
  StartTimer(&Timer);
  idx2_PropagateIfError(FlushChunks(*Idx2, &E));
  idx2_PropagateIfError(FlushChunkExponents(*Idx2, &E));
  TotalTime_ += Seconds(ElapsedTime(&Timer));

  cstr MetaFileName = idx2_PrintScratch("%s/%s/%s.idx2", P.OutDir, P.Meta.Name, P.Meta.Field);
  WriteMetaFile(*Idx2, P, MetaFileName);
  printf("num channels            = %" PRIi64 "\n", Size(E.Channels));
  printf("num sub channels        = %" PRIi64 "\n", Size(E.SubChannels));
  MetaFileName = idx2_PrintScratch("%s/%s/%s.idx2", P.OutDir, P.Meta.Name, P.Meta.Field);
  PrintStats(MetaFileName);
  printf("total time              = %f seconds\n", TotalTime_);
  //  _ASSERTE( _CrtCheckMemory( ) );
  return idx2_Error(idx2_err_code::NoError);
}